

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

void __thiscall
Js::JavascriptString::FinishCopy
          (JavascriptString *this,char16 *buffer,StringCopyInfoStack *nestedStringTreeCopyInfos)

{
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  charcount_t cVar4;
  JavascriptString *pJVar5;
  undefined4 *puVar6;
  char16 *pcVar7;
  undefined1 local_38 [8];
  StringCopyInfo copyInfo;
  StringCopyInfoStack *nestedStringTreeCopyInfos_local;
  char16 *buffer_local;
  JavascriptString *this_local;
  
  copyInfo._16_8_ = nestedStringTreeCopyInfos;
  do {
    bVar2 = StringCopyInfoStack::IsEmpty((StringCopyInfoStack *)copyInfo._16_8_);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      return;
    }
    StringCopyInfoStack::Pop((StringCopyInfo *)local_38,(StringCopyInfoStack *)copyInfo._16_8_);
    pJVar5 = StringCopyInfo::SourceString((StringCopyInfo *)local_38);
    cVar3 = GetLength(pJVar5);
    cVar4 = GetLength(this);
    if (cVar4 < cVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                  ,0xb46,"(copyInfo.SourceString()->GetLength() <= GetLength())",
                                  "copyInfo.SourceString()->GetLength() <= GetLength()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pcVar7 = StringCopyInfo::DestinationBuffer((StringCopyInfo *)local_38);
    if (pcVar7 < buffer) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                  ,0xb47,"(copyInfo.DestinationBuffer() >= buffer)",
                                  "copyInfo.DestinationBuffer() >= buffer");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pcVar7 = StringCopyInfo::DestinationBuffer((StringCopyInfo *)local_38);
    cVar3 = GetLength(this);
    pJVar5 = StringCopyInfo::SourceString((StringCopyInfo *)local_38);
    cVar4 = GetLength(pJVar5);
    if (buffer + (cVar3 - cVar4) < pcVar7) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                  ,0xb48,
                                  "(copyInfo.DestinationBuffer() <= buffer + (GetLength() - copyInfo.SourceString()->GetLength()))"
                                  ,
                                  "copyInfo.DestinationBuffer() <= buffer + (GetLength() - copyInfo.SourceString()->GetLength())"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pJVar5 = StringCopyInfo::SourceString((StringCopyInfo *)local_38);
    pcVar7 = StringCopyInfo::DestinationBuffer((StringCopyInfo *)local_38);
    Copy(pJVar5,pcVar7,(StringCopyInfoStack *)copyInfo._16_8_,'\0');
  } while( true );
}

Assistant:

void JavascriptString::FinishCopy(__inout_xcount(m_charLength) char16 *const buffer, StringCopyInfoStack &nestedStringTreeCopyInfos)
    {
        while (!nestedStringTreeCopyInfos.IsEmpty())
        {
            const StringCopyInfo copyInfo(nestedStringTreeCopyInfos.Pop());
            Assert(copyInfo.SourceString()->GetLength() <= GetLength());
            Assert(copyInfo.DestinationBuffer() >= buffer);
            Assert(copyInfo.DestinationBuffer() <= buffer + (GetLength() - copyInfo.SourceString()->GetLength()));
            copyInfo.SourceString()->Copy(copyInfo.DestinationBuffer(), nestedStringTreeCopyInfos, 0);
        }
    }